

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<5,_3,_2>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  long lVar1;
  Vector<float,_2> *in_RCX;
  Type in0;
  Type in1;
  Vector<float,_3> res;
  undefined8 local_60;
  float local_58;
  undefined1 local_50 [16];
  undefined4 local_40;
  int local_38 [6];
  Matrix<float,_3,_2> local_20;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    local_60 = *(undefined8 *)(evalCtx->coords).m_data;
    local_58 = (evalCtx->coords).m_data[2];
  }
  else {
    local_60 = 0x3dcccccd3f8ccccd;
    local_58 = 0.5;
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    local_50._0_8_ = *(undefined8 *)(evalCtx->coords).m_data;
  }
  else {
    local_50._0_4_ = 0.5;
    local_50._4_4_ = 1.0;
  }
  outerProduct<float,2,3>
            (&local_20,(MatrixCaseUtils *)&local_60,(Vector<float,_3> *)local_50,in_RCX);
  local_40 = 0;
  local_50._8_8_ = 0;
  lVar1 = 0;
  do {
    *(float *)(local_50 + lVar1 * 4 + 8) =
         local_20.m_data.m_data[0].m_data[lVar1] + local_20.m_data.m_data[1].m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  local_38[2] = 0;
  local_38[3] = 1;
  local_38[4] = 2;
  lVar1 = 2;
  do {
    (evalCtx->color).m_data[local_38[lVar1]] = *(float *)(local_50 + lVar1 * 4);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(outerProduct(in0, in1));
	}